

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpool-gnu-make.cc
# Opt level: O2

void __thiscall GNUmakeTokenPool::Clear(GNUmakeTokenPool *this)

{
  while (0 < this->used_) {
    (*(this->super_TokenPool)._vptr_TokenPool[4])(this);
  }
  while (1 < this->available_) {
    Return(this);
  }
  return;
}

Assistant:

void GNUmakeTokenPool::Clear() {
  while (used_ > 0)
    Release();
  while (available_ > 1)
    Return();
}